

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubcommandTest.cpp
# Opt level: O1

void __thiscall
SubcommandProgram_CallbackOrder_Test::TestBody(SubcommandProgram_CallbackOrder_Test *this)

{
  input_t *piVar1;
  pointer *ppiVar2;
  bool bVar3;
  char *pcVar4;
  long lVar5;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  AssertionResult gtest_ar;
  vector<int,_std::allocator<int>_> callback_order;
  allocator_type local_f1;
  AssertHelper local_f0;
  internal local_e8 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e0;
  vector<int,_std::allocator<int>_> local_d8;
  undefined1 *local_b8 [2];
  undefined1 local_a8 [16];
  vector<int,_std::allocator<int>_> local_98;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_58._8_8_ = 0;
  pcStack_40 = CLI::std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp:635:25)>
               ::_M_invoke;
  local_48 = CLI::std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp:635:25)>
             ::_M_manager;
  local_58._M_unused._M_object = &local_98;
  CLI::std::function<void_()>::operator=
            (&((this->super_SubcommandProgram).start)->callback_,(function<void_()> *)&local_58);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  local_78._8_8_ = 0;
  pcStack_60 = CLI::std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp:636:24)>
               ::_M_invoke;
  local_68 = CLI::std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp:636:24)>
             ::_M_manager;
  local_78._M_unused._M_object = &local_98;
  CLI::std::function<void_()>::operator=
            (&((this->super_SubcommandProgram).stop)->callback_,(function<void_()> *)&local_78);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  ppiVar2 = &local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)ppiVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"start","");
  local_b8[0] = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"stop","");
  piVar1 = &(this->super_SubcommandProgram).super_TApp.args;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,&local_d8,
             &local_98);
  lVar5 = 0;
  do {
    if (local_a8 + lVar5 != *(undefined1 **)((long)local_b8 + lVar5)) {
      operator_delete(*(undefined1 **)((long)local_b8 + lVar5));
    }
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != -0x40);
  TApp::run((TApp *)this);
  local_f0.data_ = (AssertHelperData *)0x200000001;
  __l._M_len = 2;
  __l._M_array = (iterator)&local_f0;
  CLI::std::vector<int,_std::allocator<int>_>::vector(&local_d8,__l,&local_f1);
  testing::internal::
  CmpHelperEQ<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>
            (local_e8,"callback_order","std::vector<int>({1, 2})",&local_98,&local_d8);
  if ((pointer *)
      local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer *)0x0) {
    operator_delete(local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d8);
    if (local_e0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_e0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0x280,pcVar4);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    if ((pointer *)
        local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((pointer *)
          local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer *)0x0)) {
        (**(code **)(*(pointer *)
                      local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start + 2))();
      }
      local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_e0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  CLI::App::reset(&(this->super_SubcommandProgram).super_TApp.app);
  if (local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  }
  local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)ppiVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"stop","");
  local_b8[0] = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"start","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,&local_d8,
             &local_98);
  lVar5 = 0;
  do {
    if (local_a8 + lVar5 != *(undefined1 **)((long)local_b8 + lVar5)) {
      operator_delete(*(undefined1 **)((long)local_b8 + lVar5));
    }
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != -0x40);
  TApp::run((TApp *)this);
  local_f0.data_ = (AssertHelperData *)0x100000002;
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&local_f0;
  CLI::std::vector<int,_std::allocator<int>_>::vector(&local_d8,__l_00,&local_f1);
  testing::internal::
  CmpHelperEQ<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>
            (local_e8,"callback_order","std::vector<int>({2, 1})",&local_98,&local_d8);
  if ((pointer *)
      local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer *)0x0) {
    operator_delete(local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d8);
    if (local_e0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_e0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0x287,pcVar4);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    if ((pointer *)
        local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((pointer *)
          local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer *)0x0)) {
        (**(code **)(*(pointer *)
                      local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start + 2))();
      }
      local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_e0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST_F(SubcommandProgram, CallbackOrder) {
    std::vector<int> callback_order;
    start->set_callback([&callback_order]() { callback_order.push_back(1); });
    stop->set_callback([&callback_order]() { callback_order.push_back(2); });

    args = {"start", "stop"};
    run();
    EXPECT_EQ(callback_order, std::vector<int>({1, 2}));

    app.reset();
    callback_order.clear();

    args = {"stop", "start"};
    run();
    EXPECT_EQ(callback_order, std::vector<int>({2, 1}));
}